

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_main.cpp
# Opt level: O2

void Error(FlatCompiler *flatc,string *err,bool usage,bool show_exe_name)

{
  FILE *__stream;
  undefined3 in_register_00000009;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  if (CONCAT31(in_register_00000009,show_exe_name) != 0) {
    printf("%s: ",g_program_name);
  }
  __stream = _stderr;
  if ((flatc != (FlatCompiler *)0x0) && (usage)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,g_program_name,&local_69)
    ;
    flatbuffers::FlatCompiler::GetShortUsageString(&local_48,flatc,&local_68);
    fprintf(__stream,"%s\n",local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  fprintf(_stderr,"\nerror:\n  %s\n\n",(err->_M_dataplus)._M_p);
  exit(1);
}

Assistant:

static void Error(const flatbuffers::FlatCompiler *flatc,
                  const std::string &err, bool usage, bool show_exe_name) {
  if (show_exe_name) { printf("%s: ", g_program_name); }
  if (usage && flatc) {
    fprintf(stderr, "%s\n", flatc->GetShortUsageString(g_program_name).c_str());
  }
  fprintf(stderr, "\nerror:\n  %s\n\n", err.c_str());
  exit(1);
}